

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsCreatePromise(JsValueRef *promise,JsValueRef *resolve,JsValueRef *reject)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  JsrtContext *currentContext;
  undefined4 *puVar4;
  JavascriptPromise *promise_00;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_70 [8];
  EnterScriptObject __enterScriptObject;
  JavascriptPromiseResolveOrRejectFunction *jsResolve;
  JavascriptPromiseResolveOrRejectFunction *jsReject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  currentContext = JsrtContext::GetCurrent();
  JVar3 = CheckContext(currentContext,false,false);
  if (JVar3 == JsNoError) {
    scriptContext =
         (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&jsReject + 4),
               ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_a8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_70,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_70);
    if (scriptContext->TTDShouldPerformRecordAction == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                         ,0x3c6,"(false)","Need to implement support here!!!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    JVar3 = JsErrorNullArgument;
    if (reject != (JsValueRef *)0x0 &&
        (resolve != (JsValueRef *)0x0 && promise != (JsValueRef *)0x0)) {
      *promise = (JsValueRef)0x0;
      *resolve = (JsValueRef)0x0;
      *reject = (JsValueRef)0x0;
      __enterScriptObject.library = (JavascriptLibrary *)0x0;
      jsResolve = (JavascriptPromiseResolveOrRejectFunction *)0x0;
      promise_00 = Js::JavascriptLibrary::CreatePromise
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      Js::JavascriptPromise::InitializePromise
                (promise_00,
                 (JavascriptPromiseResolveOrRejectFunction **)&__enterScriptObject.library,
                 &jsResolve,scriptContext);
      *promise = promise_00;
      *resolve = __enterScriptObject.library;
      *reject = jsResolve;
      JVar3 = JsNoError;
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_70);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&jsReject + 4));
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsCreatePromise(_Out_ JsValueRef *promise, _Out_ JsValueRef *resolve, _Out_ JsValueRef *reject)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        PARAM_NOT_NULL(promise);
        PARAM_NOT_NULL(resolve);
        PARAM_NOT_NULL(reject);

        *promise = nullptr;
        *resolve = nullptr;
        *reject = nullptr;

        Js::JavascriptPromiseResolveOrRejectFunction *jsResolve = nullptr;
        Js::JavascriptPromiseResolveOrRejectFunction *jsReject = nullptr;
        Js::JavascriptPromise *jsPromise = scriptContext->GetLibrary()->CreatePromise();
        Js::JavascriptPromise::InitializePromise(jsPromise, &jsResolve, &jsReject, scriptContext);

        *promise = (JsValueRef)jsPromise;
        *resolve = (JsValueRef)jsResolve;
        *reject = (JsValueRef)jsReject;

        return JsNoError;
    });
}